

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_mame.c
# Opt level: O2

void qsound_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  ushort uVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  uint uVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  lVar3 = *(long *)((long)param + 0x260);
  if ((lVar3 != 0) && (*(int *)((long)param + 0x268) != 0)) {
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      if ((*(char *)((long)param + lVar4 * 0x24 + 0x32) != '\0') &&
         (puVar5 = (uint *)((long)param + lVar4 * 0x24 + 0x20), (char)puVar5[8] == '\0')) {
        for (uVar6 = 0; samples != uVar6; uVar6 = uVar6 + 1) {
          uVar7 = (puVar5[7] >> 0xc) + puVar5[1];
          puVar5[1] = uVar7;
          uVar9 = (puVar5[7] & 0xfff) + puVar5[3];
          puVar5[7] = uVar9;
          uVar1 = *(ushort *)((long)puVar5 + 10);
          if (uVar1 <= uVar7) {
            uVar2 = (ushort)puVar5[2];
            if (uVar2 == 0) {
              puVar5[1] = uVar7 - 1;
              puVar5[7] = uVar9 + 0x1000;
              break;
            }
            uVar8 = uVar1 - uVar2;
            if (uVar7 - uVar2 < (uint)uVar1) {
              uVar8 = (ushort)(uVar7 - uVar2);
            }
            uVar7 = (uint)uVar8;
            puVar5[1] = uVar7;
          }
          iVar10 = (uint)(ushort)puVar5[4] *
                   (int)*(char *)(lVar3 + (ulong)((uVar7 | *puVar5) & *(uint *)((long)param + 0x26c)
                                                 ));
          (*outputs)[uVar6] = (*outputs)[uVar6] + ((int)(puVar5[5] * iVar10) >> 0xe);
          outputs[1][uVar6] = outputs[1][uVar6] + ((int)(iVar10 * puVar5[6]) >> 0xe);
        }
      }
    }
  }
  return;
}

Assistant:

static void qsound_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	qsound_state *chip = (qsound_state *)param;
	UINT32 i,j;
	UINT32 offset;
	INT8 sample;
	qsound_channel *pC;

	// Clear the buffers
	memset(outputs[0], 0, samples * sizeof(*outputs[0]));
	memset(outputs[1], 0, samples * sizeof(*outputs[1]));
	if (chip->sample_rom == NULL || ! chip->sample_rom_length)
		return;

	for (j = 0; j < QSOUND_CHANNELS; j++)
	{
		pC=&chip->channel[j];
		if (pC->enabled && ! pC->Muted)
		{
			// Go through the buffer and add voice contributions
			for (i = 0; i < samples; i++)
			{
				pC->address += (pC->step_ptr >> 12);
				pC->step_ptr &= 0xfff;
				pC->step_ptr += pC->freq;

				if (pC->address >= pC->end)
				{
					if (pC->loop)
					{
						// Reached the end, restart the loop
						pC->address -= pC->loop;

						// Make sure we don't overflow (what does the real chip do in this case?)
						if (pC->address >= pC->end)
							pC->address = pC->end - pC->loop;

						pC->address &= 0xffff;
					}
					else
					{
						// Reached the end of a non-looped sample
						//pC->enabled = 0;
						pC->address --;	// ensure that old ripped VGMs still work
						pC->step_ptr += 0x1000;
						break;
					}
				}
				
				offset = pC->bank | pC->address;
				sample = chip->sample_rom[offset & chip->sample_rom_mask];
				outputs[0][i] += ((sample * pC->lvol * pC->vol) >> 14);
				outputs[1][i] += ((sample * pC->rvol * pC->vol) >> 14);
			}
		}
	}
}